

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5AppendPoslist(Fts5Index *p,u64 iDelta,Fts5Iter *pMulti,Fts5Buffer *pBuf)

{
  int iVar1;
  Fts5Buffer *in_RCX;
  int *in_RDX;
  long in_RDI;
  int nByte;
  int nData;
  uchar *in_stack_ffffffffffffffc8;
  int local_2c;
  u32 nByte_00;
  
  nByte_00 = in_RDX[4];
  if (*(int *)(in_RDI + 0x3c) == 0) {
    if ((uint)in_RCX->nSpace < in_RCX->n + nByte_00 + 0x1a) {
      local_2c = sqlite3Fts5BufferSize(in_RDX,in_RCX,nByte_00);
    }
    else {
      local_2c = 0;
    }
    if (local_2c == 0) {
      iVar1 = sqlite3Fts5PutVarint(in_stack_ffffffffffffffc8,0x280645);
      in_RCX->n = iVar1 + in_RCX->n;
      iVar1 = sqlite3Fts5PutVarint(in_stack_ffffffffffffffc8,0x280674);
      in_RCX->n = iVar1 + in_RCX->n;
      memcpy(in_RCX->p + in_RCX->n,*(void **)(in_RDX + 2),(long)(int)nByte_00);
      in_RCX->n = nByte_00 + in_RCX->n;
      memset(in_RCX->p + in_RCX->n,0,8);
    }
  }
  return;
}

Assistant:

static void fts5AppendPoslist(
  Fts5Index *p,
  u64 iDelta,
  Fts5Iter *pMulti,
  Fts5Buffer *pBuf
){
  int nData = pMulti->base.nData;
  int nByte = nData + 9 + 9 + FTS5_DATA_ZERO_PADDING;
  assert( nData>0 );
  if( p->rc==SQLITE_OK && 0==fts5BufferGrow(&p->rc, pBuf, nByte) ){
    fts5BufferSafeAppendVarint(pBuf, iDelta);
    fts5BufferSafeAppendVarint(pBuf, nData*2);
    fts5BufferSafeAppendBlob(pBuf, pMulti->base.pData, nData);
    memset(&pBuf->p[pBuf->n], 0, FTS5_DATA_ZERO_PADDING);
  }
}